

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O3

void __thiscall duckdb::BinarySerializer::VarIntEncode<long>(BinarySerializer *this,long value)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t buffer [16];
  byte local_18 [24];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_18[4] = 0;
  local_18[5] = 0;
  local_18[6] = 0;
  local_18[7] = 0;
  local_18[8] = 0;
  local_18[9] = 0;
  local_18[10] = 0;
  local_18[0xb] = 0;
  local_18[0xc] = 0;
  local_18[0xd] = 0;
  local_18[0xe] = 0;
  local_18[0xf] = 0;
  lVar2 = 0;
  if (0x3f < (ulong)value) {
    uVar1 = value & 0xffffffff;
    uVar3 = value;
    do {
      uVar4 = (long)uVar3 >> 7;
      value = uVar1;
      if ((uVar4 == 0xffffffffffffffff & (byte)(((uint)uVar3 & 0x40) >> 6)) != 0) break;
      local_18[lVar2] = (byte)uVar1 | 0x80;
      lVar2 = lVar2 + 1;
      uVar1 = uVar4 & 0xffffffff;
      value = uVar4;
      uVar3 = uVar4;
    } while (0x3f < uVar4);
  }
  local_18[lVar2] = (byte)value & 0x7f;
  (**this->stream->_vptr_WriteStream)(this->stream,local_18,lVar2 + 1);
  return;
}

Assistant:

void VarIntEncode(T value) {
		uint8_t buffer[16] = {};
		auto write_size = EncodingUtil::EncodeLEB128<T>(buffer, value);
		D_ASSERT(write_size <= sizeof(buffer));
		WriteData(buffer, write_size);
	}